

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexInputTests.cpp
# Opt level: O0

deUint32 vkt::pipeline::anon_unknown_0::getAttributeBinding
                   (BindingMapping bindingMapping,VkVertexInputRate inputRate,deUint32 attributeNdx)

{
  deUint32 attributeNdx_local;
  VkVertexInputRate inputRate_local;
  BindingMapping bindingMapping_local;
  
  if (bindingMapping == BINDING_MAPPING_ONE_TO_ONE) {
    if (inputRate == VK_VERTEX_INPUT_RATE_VERTEX) {
      inputRate_local = attributeNdx << 1;
    }
    else {
      inputRate_local = attributeNdx * 2 + VK_VERTEX_INPUT_RATE_INSTANCE;
    }
  }
  else if (inputRate == VK_VERTEX_INPUT_RATE_VERTEX) {
    inputRate_local = VK_VERTEX_INPUT_RATE_VERTEX;
  }
  else {
    inputRate_local = VK_VERTEX_INPUT_RATE_INSTANCE;
  }
  return inputRate_local;
}

Assistant:

deUint32 getAttributeBinding (const VertexInputTest::BindingMapping bindingMapping, const VkVertexInputRate inputRate, const deUint32 attributeNdx)
{
	if (bindingMapping == VertexInputTest::BINDING_MAPPING_ONE_TO_ONE)
	{
		if (inputRate == VK_VERTEX_INPUT_RATE_VERTEX)
			return attributeNdx * 2;		// Even binding number
		else // inputRate == VK_VERTEX_INPUT_STEP_RATE_INSTANCE
			return attributeNdx * 2 + 1;	// Odd binding number
	}
	else // bindingMapping == BINDING_MAPPING_ONE_TO_MANY
	{
		if (inputRate == VK_VERTEX_INPUT_RATE_VERTEX)
			return 0u;
		else // inputRate == VK_VERTEX_INPUT_STEP_RATE_INSTANCE
			return 1u;
	}
}